

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write_float<char,fmt::v11::basic_appender<char>,float>
          (basic_appender<char> out,float value,format_specs specs,locale_ref loc)

{
  string_view bytes;
  locale_ref loc_00;
  locale_ref loc_01;
  format_specs specs_00;
  bool bVar1;
  presentation_type pVar2;
  align aVar3;
  int iVar4;
  int iVar5;
  basic_appender<char> bVar6;
  char *s_00;
  size_t count;
  size_t *in_RCX;
  long in_RDX;
  uchar *sig;
  basic_specs in_RSI;
  buffer<char> *in_RDI;
  uchar *in_R8;
  size_t in_R9;
  float in_XMM0_Da;
  big_decimal_fp *f_00;
  big_decimal_fp f;
  int exp;
  memory_buffer buffer;
  decimal_fp<float> dec;
  int precision;
  int exp_upper;
  sign s;
  undefined7 in_stack_fffffffffffffca8;
  char in_stack_fffffffffffffcaf;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffcb0;
  buffer<char> *this;
  undefined8 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  decimal_fp<float> *in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  int in_stack_fffffffffffffcd4;
  basic_appender<char> in_stack_fffffffffffffcd8;
  sign local_304;
  undefined8 in_stack_fffffffffffffd00;
  basic_specs in_stack_fffffffffffffd08;
  undefined8 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  float in_stack_fffffffffffffd24;
  basic_string_view<char> local_2d0;
  buffer<char> *local_2c0;
  basic_specs local_2b8;
  long lStack_2b0;
  undefined6 in_stack_fffffffffffffd68;
  char in_stack_fffffffffffffd6e;
  undefined1 in_stack_fffffffffffffd6f;
  char *in_stack_fffffffffffffd70;
  format_specs in_stack_fffffffffffffd78;
  buffer<char> *in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe67;
  format_specs *in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe74;
  double in_stack_fffffffffffffe78;
  int local_60;
  basic_appender<char> local_58;
  basic_specs local_50;
  long local_48;
  buffer<char> *local_40;
  sign local_38;
  float local_34;
  basic_specs local_28;
  undefined8 uStack_20;
  basic_appender<char> local_18;
  buffer<char> *local_10;
  
  local_34 = in_XMM0_Da;
  local_28 = in_RSI;
  uStack_20 = in_RDX;
  local_18.container = in_RDI;
  bVar1 = std::signbit((double)in_XMM0_Da);
  if (bVar1) {
    local_304 = minus;
  }
  else {
    local_304 = basic_specs::sign(&local_28,(EVP_PKEY_CTX *)in_RSI,sig,in_RCX,in_R8,in_R9);
  }
  local_38 = local_304;
  bVar1 = isfinite<float,_0>(0.0);
  if (bVar1) {
    aVar3 = basic_specs::align(&local_28);
    if ((aVar3 == numeric) && (local_38 != none)) {
      getsign<char>(local_38);
      local_58 = basic_appender<char>::operator++(&local_18,0);
      basic_appender<char>::operator*(&local_58);
      basic_appender<char>::operator=
                ((basic_appender<char> *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcaf);
      local_38 = none;
      if ((int)uStack_20 != 0) {
        uStack_20 = CONCAT44(uStack_20._4_4_,(int)uStack_20 + -1);
      }
    }
    local_60 = uStack_20._4_4_;
    if (uStack_20 < 0) {
      pVar2 = basic_specs::type(&local_28);
      if (pVar2 == none) {
        dragonbox::to_decimal<float>(in_stack_fffffffffffffd24);
        loc_00.locale_._4_4_ = in_stack_fffffffffffffcd4;
        loc_00.locale_._0_4_ = in_stack_fffffffffffffcd0;
        bVar6 = write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>>
                          (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcc8,
                           (format_specs *)
                           CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                           (sign)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                           (int)in_stack_fffffffffffffcb8,loc_00);
        return (basic_appender<char>)bVar6.container;
      }
      local_60 = 6;
    }
    basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffcb0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
    pVar2 = basic_specs::type(&local_28);
    if (pVar2 == hex) {
      if (local_38 != none) {
        in_stack_fffffffffffffd6e = getsign<char>(local_38);
        buffer<char>::push_back
                  (&in_stack_fffffffffffffcb0->super_buffer<char>,
                   (char *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
      }
      convert_float<float>(local_34);
      local_2b8 = local_28;
      lStack_2b0 = uStack_20;
      format_hexfloat<double,_0>
                ((double)in_stack_fffffffffffffd70,in_stack_fffffffffffffd78,
                 (buffer<char> *)
                 CONCAT17(in_stack_fffffffffffffd6f,
                          CONCAT16(in_stack_fffffffffffffd6e,in_stack_fffffffffffffd68)));
      local_2c0 = local_18.container;
      bVar6.container = (buffer<char> *)&stack0xfffffffffffffd70;
      s_00 = buffer<char>::data(bVar6.container);
      count = buffer<char>::size(bVar6.container);
      basic_string_view<char>::basic_string_view(&local_2d0,s_00,count);
      bytes.size_._0_4_ = in_stack_fffffffffffffcd0;
      bytes.data_ = (char *)in_stack_fffffffffffffcc8;
      bytes.size_._4_4_ = in_stack_fffffffffffffcd4;
      local_10 = (buffer<char> *)
                 write_bytes<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>>
                           (bVar6,bytes,
                            (format_specs *)
                            CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    }
    else {
      pVar2 = basic_specs::type(&local_28);
      if (pVar2 == debug) {
        in_stack_fffffffffffffcd4 = local_60;
        iVar4 = max_value<int>();
        if (in_stack_fffffffffffffcd4 == iVar4) {
          report_error((char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
        }
        local_60 = local_60 + 1;
        if (uStack_20._4_4_ != 0) {
          basic_specs::set_alt(&local_28);
        }
      }
      else {
        pVar2 = basic_specs::type(&local_28);
        if (pVar2 == fixed) {
          if (uStack_20._4_4_ != 0) {
            basic_specs::set_alt(&local_28);
          }
        }
        else if (local_60 == 0) {
          local_60 = 1;
        }
      }
      f_00 = (big_decimal_fp *)convert_float<float>(local_34);
      iVar4 = local_60;
      std::integral_constant::operator_cast_to_bool((integral_constant *)&stack0xfffffffffffffd27);
      iVar5 = format_float<double>
                        (in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
                         in_stack_fffffffffffffe68,(bool)in_stack_fffffffffffffe67,
                         in_stack_fffffffffffffe58);
      uStack_20 = CONCAT44(local_60,(int)uStack_20);
      this = (buffer<char> *)&stack0xfffffffffffffd70;
      buffer<char>::data(this);
      buffer<char>::size(this);
      loc_01.locale_._4_4_ = in_stack_fffffffffffffcd4;
      loc_01.locale_._0_4_ = in_stack_fffffffffffffcd0;
      local_10 = (buffer<char> *)
                 write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp>
                           (in_stack_fffffffffffffcd8,f_00,(format_specs *)CONCAT44(iVar5,iVar4),
                            (sign)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                            (int)in_stack_fffffffffffffcb8,loc_01);
    }
    basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::~basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *)0x26e78d);
  }
  else {
    local_40 = local_18.container;
    isnan<float>(local_34);
    local_50 = local_28;
    local_48 = uStack_20;
    bVar6.container._4_4_ = in_stack_fffffffffffffd1c;
    bVar6.container._0_4_ = in_stack_fffffffffffffd18;
    specs_00.width = (int)in_stack_fffffffffffffd10;
    specs_00.precision = (int)((ulong)in_stack_fffffffffffffd10 >> 0x20);
    specs_00.super_basic_specs = in_stack_fffffffffffffd08;
    local_10 = (buffer<char> *)
               write_nonfinite<char,fmt::v11::basic_appender<char>>
                         (bVar6,SUB81((ulong)in_stack_fffffffffffffd00 >> 0x38,0),specs_00,
                          (sign)in_stack_fffffffffffffd00);
  }
  return (basic_appender<char>)local_10;
}

Assistant:

FMT_CONSTEXPR20 auto write_float(OutputIt out, T value, format_specs specs,
                                 locale_ref loc) -> OutputIt {
  // Use signbit because value < 0 is false for NaN.
  sign s = detail::signbit(value) ? sign::minus : specs.sign();

  if (!detail::isfinite(value))
    return write_nonfinite<Char>(out, detail::isnan(value), specs, s);

  if (specs.align() == align::numeric && s != sign::none) {
    *out++ = detail::getsign<Char>(s);
    s = sign::none;
    if (specs.width != 0) --specs.width;
  }

  constexpr int exp_upper = detail::exp_upper<T>();
  int precision = specs.precision;
  if (precision < 0) {
    if (specs.type() != presentation_type::none) {
      precision = 6;
    } else if (is_fast_float<T>::value && !is_constant_evaluated()) {
      // Use Dragonbox for the shortest format.
      using floaty = conditional_t<sizeof(T) >= sizeof(double), double, float>;
      auto dec = dragonbox::to_decimal(static_cast<floaty>(value));
      return write_float<Char>(out, dec, specs, s, exp_upper, loc);
    }
  }

  memory_buffer buffer;
  if (specs.type() == presentation_type::hexfloat) {
    if (s != sign::none) buffer.push_back(detail::getsign<char>(s));
    format_hexfloat(convert_float(value), specs, buffer);
    return write_bytes<Char, align::right>(out, {buffer.data(), buffer.size()},
                                           specs);
  }

  if (specs.type() == presentation_type::exp) {
    if (precision == max_value<int>())
      report_error("number is too big");
    else
      ++precision;
    if (specs.precision != 0) specs.set_alt();
  } else if (specs.type() == presentation_type::fixed) {
    if (specs.precision != 0) specs.set_alt();
  } else if (precision == 0) {
    precision = 1;
  }
  int exp = format_float(convert_float(value), precision, specs,
                         std::is_same<T, float>(), buffer);

  specs.precision = precision;
  auto f = big_decimal_fp{buffer.data(), static_cast<int>(buffer.size()), exp};
  return write_float<Char>(out, f, specs, s, exp_upper, loc);
}